

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O1

void cht_Suicide(player_t *plyr)

{
  DThinker *this;
  APlayerPawn *pointed;
  
  if (plyr->mo != (APlayerPawn *)0x0) {
    this = (DThinker *)
           M_Malloc_Dbg(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                        ,0x1f9);
    DThinker::DThinker(this,100);
    (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f99e8;
    pointed = plyr->mo;
    this[1].super_DObject._vptr_DObject = (_func_int **)pointed;
    if ((pointed != (APlayerPawn *)0x0) &&
       (((pointed->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      this[1].super_DObject._vptr_DObject = (_func_int **)0x0;
      pointed = (APlayerPawn *)0x0;
    }
    if (((pointed != (APlayerPawn *)0x0) &&
        (((pointed->super_AActor).super_DThinker.super_DObject.ObjectFlags & 3) != 0)) &&
       (((this->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier((DObject *)this,(DObject *)pointed);
      return;
    }
  }
  return;
}

Assistant:

void cht_Suicide (player_t *plyr)
{
	// If this cheat was initiated by the suicide ccmd, and this is a single
	// player game, the CHT_SUICIDE will be processed before the tic is run,
	// so the console has not gone up yet. Use a temporary thinker to delay
	// the suicide until the game ticks so that death noises can be heard on
	// the initial tick.
	if (plyr->mo != NULL)
	{
		DSuicider *suicide = new DSuicider;
		suicide->Pawn = plyr->mo;
		GC::WriteBarrier(suicide, suicide->Pawn);
	}
}